

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O0

SQRESULT sqstd_writeclosuretofile(HSQUIRRELVM v,SQChar *filename)

{
  SQFILE pvVar1;
  long lVar2;
  undefined8 in_RDI;
  SQFILE file;
  SQChar *in_stack_ffffffffffffffd8;
  SQChar *in_stack_ffffffffffffffe0;
  SQRESULT local_8;
  
  pvVar1 = sqstd_fopen(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (pvVar1 == (SQFILE)0x0) {
    local_8 = sq_throwerror(in_RDI,"cannot open the file");
  }
  else {
    lVar2 = sq_writeclosure(in_RDI,file_write,pvVar1);
    if (lVar2 < 0) {
      sqstd_fclose((SQFILE)0x108fbf);
      local_8 = -1;
    }
    else {
      sqstd_fclose((SQFILE)0x108faa);
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

SQRESULT sqstd_writeclosuretofile(HSQUIRRELVM v,const SQChar *filename)
{
    SQFILE file = sqstd_fopen(filename,_SC("wb+"));
    if(!file) return sq_throwerror(v,_SC("cannot open the file"));
    if(SQ_SUCCEEDED(sq_writeclosure(v,file_write,file))) {
        sqstd_fclose(file);
        return SQ_OK;
    }
    sqstd_fclose(file);
    return SQ_ERROR; //forward the error
}